

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib659.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                  ,0x26,iVar2,uVar4);
  }
  if (iVar2 != 0) {
    return iVar2;
  }
  lVar5 = curl_easy_init();
  if (lVar5 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                  ,0x27);
    iVar2 = 0x7c;
    lVar6 = 0;
    goto LAB_00102373;
  }
  lVar6 = curl_url();
  if (lVar6 == 0) {
    lVar6 = 0;
    curl_mfprintf(_stderr,"problem init URL api.");
LAB_00102371:
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    iVar3 = curl_url_set(lVar6,5,"www.example.com",0);
    if ((iVar3 == 0) && (iVar3 = curl_url_set(lVar6,1,"http",0), iVar3 == 0)) {
      iVar3 = curl_url_set(lVar6,6,"80",0);
      if (iVar3 == 0) {
        iVar3 = curl_easy_setopt(lVar5,0x282a,lVar6);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                        ,0x38,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if (iVar2 != 0) goto LAB_00102373;
        iVar3 = curl_easy_setopt(lVar5,0x29,1);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                        ,0x39,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if (iVar2 != 0) goto LAB_00102373;
        iVar3 = curl_easy_setopt(lVar5,0x2714,URL);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                        ,0x3a,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if (iVar2 != 0) goto LAB_00102373;
        iVar2 = curl_easy_perform(lVar5);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar4 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_perform() failed with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                        ,0x40,iVar2,uVar4);
          goto LAB_00102373;
        }
        goto LAB_00102371;
      }
    }
    curl_mfprintf(_stderr,"problem setting CURLUPART");
  }
LAB_00102373:
  curl_url_cleanup(lVar6);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURLcode res = 0;
  CURLU *urlp = NULL;

  global_init(CURL_GLOBAL_ALL);
  easy_init(handle);

  urlp = curl_url();

  if(!urlp) {
    fprintf(stderr, "problem init URL api.");
    goto test_cleanup;
  }

  /* this doesn't set the PATH part */
  if(curl_url_set(urlp, CURLUPART_HOST, "www.example.com", 0) ||
     curl_url_set(urlp, CURLUPART_SCHEME, "http", 0) ||
     curl_url_set(urlp, CURLUPART_PORT, "80", 0)) {
    fprintf(stderr, "problem setting CURLUPART");
    goto test_cleanup;
  }

  easy_setopt(handle, CURLOPT_CURLU, urlp);
  easy_setopt(handle, CURLOPT_VERBOSE, 1L);
  easy_setopt(handle, CURLOPT_PROXY, URL);

  res = curl_easy_perform(handle);

  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

test_cleanup:

  curl_url_cleanup(urlp);
  curl_easy_cleanup(handle);
  curl_global_cleanup();

  return res;
}